

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XcmEvents.c
# Opt level: O1

void XcmeSelectInput(XcmeContext_s *c)

{
  Display *pDVar1;
  Window WVar2;
  bool bVar3;
  undefined8 uVar4;
  Window *pWVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  Window *windows;
  int format;
  Atom actual;
  unsigned_long left;
  unsigned_long nWindow;
  
  nWindow = 0;
  windows = (Window *)0x0;
  actual = 0;
  format = 0;
  left = 0;
  pDVar1 = c->display;
  WVar2 = c->root;
  uVar4 = XInternAtom(pDVar1,"_NET_CLIENT_LIST",0);
  XGetWindowProperty(pDVar1,WVar2,uVar4,0,0xffffffffffffffff,0,0x21,&actual,&format,&nWindow,&left,
                     &windows);
  lVar10 = left + nWindow;
  lVar8 = lVar10 << 0x20;
  if (lVar8 != 0) {
    lVar7 = 0;
    do {
      bVar3 = false;
      if (0 < (long)c->nWindows) {
        lVar6 = 0;
        do {
          if (windows[lVar7] == c->Windows[lVar6]) {
            bVar3 = true;
          }
          lVar6 = lVar6 + 1;
        } while (c->nWindows != lVar6);
      }
      if ((c->w != windows[lVar7]) && (!bVar3)) {
        XSelectInput(c->display,windows[lVar7],0x408000);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != (lVar8 >> 0x20) + (ulong)(lVar8 >> 0x20 == 0));
  }
  iVar9 = (int)lVar10;
  if (c->nWindows < iVar9) {
    if (c->Windows != (Window *)0x0) {
      free(c->Windows);
    }
    pWVar5 = (Window *)malloc(lVar8 >> 0x1d);
    c->Windows = pWVar5;
  }
  memcpy(c->Windows,windows,lVar8 >> 0x1d);
  c->nWindows = iVar9;
  return;
}

Assistant:

void XcmeSelectInput( XcmeContext_s * c )
{
        unsigned long nWindow = 0;
        Window * windows = 0;
  Atom actual = 0;
  int format = 0;
  unsigned long left = 0, n = 0, i,j;

        XGetWindowProperty( c->display, c->root,
          XInternAtom( c->display, "_NET_CLIENT_LIST", False), 0, ~0, False, XA_WINDOW, &actual, &format,
          &nWindow, &left, (unsigned char**)&windows );
        n = (int)(nWindow + left);

        for(i = 0; i < n; ++i)
        {
          /* search of a previous observation of a particular window */
          int found = 0;
          for(j = 0; (int)j < c->nWindows; ++j)
          {
            if(windows[i] == c->Windows[j])
              found = 1;
          }

          /* other new windows but not own */
          if( c->w != windows[i] &&
              !found )
          {
            /* observe other windows */
            XSelectInput( c->display, windows[i],
                       PropertyChangeMask |  /* Xcolor properties */
                       ExposureMask );       /* Xcolor client messages */
          }
        }

        if((int)n > c->nWindows)
        {
          if(c->Windows) free(c->Windows);
          c->Windows = (Window*)malloc( sizeof(Window) * n );
        }
        memcpy( c->Windows, windows, sizeof(Window) * n );
        c->nWindows = n;
}